

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O0

void __thiscall
embree::SceneGraph::PlyParser::loadPropertyData
          (PlyParser *this,vector<float,_std::allocator<float>_> *vec,Tag ty)

{
  runtime_error *this_00;
  undefined4 in_EDX;
  PlyParser *in_RSI;
  value_type_conflict *in_stack_ffffffffffffff58;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff60;
  PlyParser *in_stack_ffffffffffffff68;
  
  switch(in_EDX) {
  case 0:
    read_char(in_stack_ffffffffffffff68);
    std::vector<float,_std::allocator<float>_>::push_back
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 1:
    read_uchar(in_stack_ffffffffffffff68);
    std::vector<float,_std::allocator<float>_>::push_back
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 2:
    read_short(in_stack_ffffffffffffff68);
    std::vector<float,_std::allocator<float>_>::push_back
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 3:
    read_ushort(in_stack_ffffffffffffff68);
    std::vector<float,_std::allocator<float>_>::push_back
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 4:
    read_int(in_stack_ffffffffffffff68);
    std::vector<float,_std::allocator<float>_>::push_back
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 5:
    read_uint(in_stack_ffffffffffffff68);
    std::vector<float,_std::allocator<float>_>::push_back
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 6:
    read_float(in_stack_ffffffffffffff68);
    std::vector<float,_std::allocator<float>_>::push_back
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 7:
    read_double(in_RSI);
    std::vector<float,_std::allocator<float>_>::push_back
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void loadPropertyData(std::vector<float>& vec, Type::Tag ty) 
      {
        switch (ty) {
        case Type::PTY_CHAR   : vec.push_back(float(read_char()));   break;
        case Type::PTY_UCHAR  : vec.push_back(float(read_uchar()));  break;
        case Type::PTY_SHORT  : vec.push_back(float(read_short()));  break;
        case Type::PTY_USHORT : vec.push_back(float(read_ushort())); break;
        case Type::PTY_INT    : vec.push_back(float(read_int()));    break;
        case Type::PTY_UINT   : vec.push_back(float(read_uint()));   break;
        case Type::PTY_FLOAT  : vec.push_back(float(read_float()));  break;
        case Type::PTY_DOUBLE : vec.push_back(float(read_double())); break;
        default : throw std::runtime_error("invalid type");
        }
      }